

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O3

void sfd_tran_ep_close(void *arg)

{
  void *pvVar1;
  
  nni_aio_close((nni_aio *)((long)arg + 0xd0));
  nni_mtx_lock((nni_mtx *)arg);
  *(undefined1 *)((long)arg + 0x3a) = 1;
  if (*(nng_stream_listener **)((long)arg + 0x2d0) != (nng_stream_listener *)0x0) {
    nng_stream_listener_close(*(nng_stream_listener **)((long)arg + 0x2d0));
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x2b0)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x2b0),pvVar1)) {
    sfd_tran_pipe_close(pvVar1);
  }
  for (pvVar1 = nni_list_first((nni_list *)((long)arg + 0x298)); pvVar1 != (void *)0x0;
      pvVar1 = nni_list_next((nni_list *)((long)arg + 0x298),pvVar1)) {
    sfd_tran_pipe_close(pvVar1);
  }
  if (*(nni_aio **)((long)arg + 200) != (nni_aio *)0x0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 200),NNG_ECLOSED);
    *(undefined8 *)((long)arg + 200) = 0;
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
sfd_tran_ep_close(void *arg)
{
	sfd_tran_ep   *ep = arg;
	sfd_tran_pipe *p;

	nni_aio_close(&ep->connaio);
	nni_mtx_lock(&ep->mtx);

	ep->closed = true;
	if (ep->listener != NULL) {
		nng_stream_listener_close(ep->listener);
	}
	NNI_LIST_FOREACH (&ep->negopipes, p) {
		sfd_tran_pipe_close(p);
	}
	NNI_LIST_FOREACH (&ep->waitpipes, p) {
		sfd_tran_pipe_close(p);
	}
	if (ep->useraio != NULL) {
		nni_aio_finish_error(ep->useraio, NNG_ECLOSED);
		ep->useraio = NULL;
	}

	nni_mtx_unlock(&ep->mtx);
}